

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wildmidi_lib.cpp
# Opt level: O1

void __thiscall WildMidi_Renderer::LongEvent(WildMidi_Renderer *this,uchar *data,int len)

{
  void *pvVar1;
  byte bVar2;
  uint uVar3;
  _patch *p_Var4;
  byte bVar5;
  int i;
  ulong uVar6;
  
  if (((((len < 0xb) || (data[(ulong)(uint)len - 1] != 0xf7)) || (*data != 0xf0)) ||
      ((data[1] != 'A' || (data[2] != '\x10')))) ||
     ((data[3] != 'B' || ((data[4] != '\x12' || (data[5] != '@')))))) {
    if (len == 9) {
      if (data[8] == 0xf7 && *(long *)data == 0x7e00004c1043f0) {
LAB_0036b44c:
        do_sysex_gm_reset((_mdi *)this->handle,(_event_data *)data);
        return;
      }
    }
    else if ((len == 6) && (*(short *)(data + 4) == -0x8ff && *(int *)data == 0x97f7ef0))
    goto LAB_0036b44c;
  }
  else {
    uVar3 = 0;
    uVar6 = 5;
    do {
      uVar3 = uVar3 + data[uVar6];
      uVar6 = uVar6 + 1;
    } while (len - 2 != uVar6);
    if (0x80 - (uVar3 & 0x7f) == (uint)data[len - 2]) {
      bVar2 = data[6];
      if (((bVar2 & 0xf0) == 0x10) && (data[7] == '\x15')) {
        bVar2 = bVar2 & 0xf;
        bVar5 = 9;
        if (bVar2 != 0) {
          bVar5 = bVar2 - (bVar2 < 10);
        }
        pvVar1 = this->handle;
        uVar6 = (ulong)((uint)bVar5 * 0x30);
        if (data[8] == '\0') {
          *(undefined1 *)((long)pvVar1 + uVar6 + 0x73) = 0;
          p_Var4 = get_patch_data(0);
          *(_patch **)((long)pvVar1 + uVar6 + 0x50) = p_Var4;
        }
        else {
          *(undefined1 *)((long)pvVar1 + uVar6 + 0x73) = 1;
          *(undefined8 *)((long)pvVar1 + uVar6 + 0x50) = 0;
        }
      }
      else if ((bVar2 == 0) && ((data[7] == '\x7f' && (data[8] == '\0')))) goto LAB_0036b44c;
    }
  }
  return;
}

Assistant:

void WildMidi_Renderer::LongEvent(const unsigned char *data, int len)
{
	// Check for Roland SysEx
	if (len >= 11 &&			// Must be at least 11 bytes
		data[len-1] == 0xF7 &&	// SysEx end
		data[0] == 0xF0 &&		// SysEx
		data[1] == 0x41 &&		// Roland
		data[2] == 0x10 &&		// Device ID, defaults to 0x10
		data[3] == 0x42 &&		// Model ID, 0x42 indicates a GS synth
		data[4] == 0x12 &&		// The other end is sending data to us
		data[5] == 0x40)		// We only care about addresses with this first byte
	{
		// Calculate checksum
		int cksum = 0;
		for (int i = 5; i < len - 2; ++i)
		{
			cksum += data[i];
		}
		cksum = 128 - (cksum & 0x7F);
		if (data[len-2] == cksum)
		{ // Check destination address
			if (((data[6] & 0xF0) == 0x10) && data[7] == 0x15)
			{ // Roland drum track setting
				unsigned char sysex_ch = data[6] & 0x0F;
				if (sysex_ch == 0)
				{
					sysex_ch = 9;
				}
				else if (sysex_ch <= 9)
				{
					sysex_ch -= 1;
				}
				_event_data ev = { sysex_ch, data[8] };
				do_sysex_roland_drum_track((_mdi *)handle, &ev);
			}
			else if (data[6] == 0x00 && data[7] == 0x7F && data[8] == 0x00)
			{ // Roland GS reset
				do_sysex_roland_reset((_mdi *)handle, NULL);
			}
		}
	}
	// For non-Roland Sysex messages */
	else
	{
		const unsigned char gm_reset[] = { 0xf0, 0x7e, 0x7f, 0x09, 0x01, 0xf7 };
		const unsigned char yamaha_reset[] = { 0xf0, 0x43, 0x10, 0x4c, 0x00, 0x00, 0x7e, 0x00, 0xf7};
		if (len == 6 && memcmp(gm_reset, data, 6) == 0)
		{
			do_sysex_gm_reset((_mdi *)handle, NULL);
		}
		else if (len == 9 && memcmp(yamaha_reset, data, 9) == 0)
		{
			do_sysex_yamaha_reset((_mdi *)handle, NULL);
		}
	}
}